

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# editline.c
# Opt level: O2

void clear_line(void)

{
  ulong uVar1;
  size_t sVar2;
  int iVar3;
  ulong uVar4;
  
  uVar1 = (long)(prompt_len + rl_point) / (long)tty_cols;
  uVar4 = uVar1 & 0xffffffff;
  sVar2 = strlen(rl_prompt);
  rl_point = -(int)sVar2;
  if (0 < (int)uVar1) {
    while (iVar3 = (int)uVar4, uVar4 = (ulong)(iVar3 - 1), iVar3 != 0) {
      tty_puts("\x1b[A");
    }
  }
  tty_put('\r');
  ceol();
  rl_point = 0;
  rl_end = 0;
  *rl_line_buffer = '\0';
  return;
}

Assistant:

static void clear_line(void)
{
    int n = (rl_point + prompt_len) / tty_cols;
    rl_point = -(int)strlen(rl_prompt);

    if (n > 0) {
        for(int k = 0; k < n; k++)
            tty_puts(line_up);
        tty_put('\r');
    }
    else {
        tty_put('\r');
    }

    ceol();

    rl_point = 0;
    rl_end = 0;
    rl_line_buffer[0] = '\0';
}